

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O1

void __thiscall
nlohmann::json_abi_v3_11_3::detail::
parser<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<const_char_*>_>
::parser(parser<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<const_char_*>_>
         *this,iterator_input_adapter<const_char_*> *adapter,
        parser_callback_t<nlohmann::json_abi_v3_11_3::basic_json<>_> *cb,bool allow_exceptions_,
        bool skip_comments)

{
  char *pcVar1;
  char cVar2;
  token_type tVar3;
  
  inja::std::
  function<bool_(int,_nlohmann::json_abi_v3_11_3::detail::parse_event_t,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_&)>
  ::function(&this->callback,cb);
  this->last_token = uninitialized;
  pcVar1 = adapter->end;
  (this->m_lexer).ia.current = adapter->current;
  (this->m_lexer).ia.end = pcVar1;
  (this->m_lexer).ignore_comments = skip_comments;
  (this->m_lexer).current = -1;
  (this->m_lexer).next_unget = false;
  (this->m_lexer).position.chars_read_total = 0;
  (this->m_lexer).position.chars_read_current_line = 0;
  (this->m_lexer).position.lines_read = 0;
  (this->m_lexer).token_string.super__Vector_base<char,_std::allocator<char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_lexer).token_string.super__Vector_base<char,_std::allocator<char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_lexer).token_string.super__Vector_base<char,_std::allocator<char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_lexer).token_buffer._M_dataplus._M_p = (pointer)&(this->m_lexer).token_buffer.field_2;
  (this->m_lexer).token_buffer._M_string_length = 0;
  (this->m_lexer).token_buffer.field_2._M_local_buf[0] = '\0';
  (this->m_lexer).error_message = "";
  (this->m_lexer).value_integer = 0;
  (this->m_lexer).value_unsigned = 0;
  (this->m_lexer).value_float = 0.0;
  cVar2 = lexer<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<const_char_*>_>
          ::get_decimal_point();
  (this->m_lexer).decimal_point_char = (int)cVar2;
  this->allow_exceptions = allow_exceptions_;
  tVar3 = lexer<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<const_char_*>_>
          ::scan(&this->m_lexer);
  this->last_token = tVar3;
  return;
}

Assistant:

explicit parser(InputAdapterType&& adapter,
                    const parser_callback_t<BasicJsonType> cb = nullptr,
                    const bool allow_exceptions_ = true,
                    const bool skip_comments = false)
        : callback(cb)
        , m_lexer(std::move(adapter), skip_comments)
        , allow_exceptions(allow_exceptions_)
    {
        // read first token
        get_token();
    }